

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O1

int jas_image_readcmpt(jas_image_t *image,uint cmptno,jas_image_coord_t x,jas_image_coord_t y,
                      jas_image_coord_t width,jas_image_coord_t height,jas_matrix_t *data)

{
  int iVar1;
  jas_image_cmpt_t *pjVar2;
  jas_stream_t *stream;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *local_68;
  long local_60;
  long local_48;
  
  iVar5 = jas_getdbglevel();
  if (99 < iVar5) {
    jas_eprintf("jas_image_readcmpt(%p, %d, %ld, %ld, %ld, %ld, %p)\n",image,(ulong)cmptno,x,y,width
                ,height,data);
  }
  if ((data != (jas_matrix_t *)0x0) && (cmptno < image->numcmpts_)) {
    pjVar2 = image->cmpts_[cmptno];
    if ((x < pjVar2->width_) &&
       (((((height + y <= pjVar2->height_ && width + x <= pjVar2->width_) && y < pjVar2->height_ &&
          (data->numrows_ != 0)) && (data->numcols_ != 0)) &&
        ((data->numcols_ == width && data->numrows_ == height ||
         (iVar5 = jas_matrix_resize(data,height,width), iVar5 == 0)))))) {
      local_68 = (ulong *)*data->rows_;
      if (data->numrows_ < 2) {
        local_48 = 0;
      }
      else {
        local_48 = (long)(int)((ulong)((long)data->rows_[1] - (long)local_68) >> 3);
      }
      if (height < 1) {
        return 0;
      }
      local_60 = 0;
      while (lVar7 = jas_stream_seek(pjVar2->stream_,
                                     (long)pjVar2->cps_ * ((local_60 + y) * pjVar2->width_ + x),0),
            -1 < lVar7) {
        lVar7 = width;
        puVar10 = local_68;
        if (0 < width) {
          do {
            if (pjVar2->cps_ < 1) {
              uVar9 = 0;
            }
            else {
              iVar5 = pjVar2->cps_ + 1;
              uVar9 = 0;
              do {
                stream = pjVar2->stream_;
                uVar6 = 0xffffffff;
                if ((stream->flags_ & 7U) == 0) {
                  if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
                    iVar1 = stream->cnt_;
                    stream->cnt_ = iVar1 + -1;
                    if (iVar1 < 1) {
                      uVar6 = jas_stream_fillbuf(stream,1);
                    }
                    else {
                      stream->rwcnt_ = stream->rwcnt_ + 1;
                      pbVar3 = stream->ptr_;
                      stream->ptr_ = pbVar3 + 1;
                      uVar6 = (uint)*pbVar3;
                    }
                  }
                  else {
                    stream->flags_ = stream->flags_ | 4;
                    uVar6 = 0xffffffff;
                  }
                }
                if (uVar6 == 0xffffffff) {
                  return -1;
                }
                uVar9 = uVar9 << 8 | (ulong)(uVar6 & 0xff);
                iVar5 = iVar5 + -1;
              } while (1 < iVar5);
            }
            bVar8 = (byte)pjVar2->prec_;
            iVar5 = 1 << (bVar8 & 0x1f);
            uVar9 = (long)(iVar5 + -1) & uVar9;
            if ((pjVar2->sgnd_ != 0) && ((uVar9 & (long)(1 << (bVar8 - 1 & 0x1f))) != 0)) {
              uVar9 = uVar9 - (long)iVar5;
            }
            *puVar10 = uVar9;
            bVar4 = 1 < lVar7;
            lVar7 = lVar7 + -1;
            puVar10 = puVar10 + 1;
          } while (bVar4);
        }
        local_60 = local_60 + 1;
        local_68 = local_68 + local_48;
        if (local_60 == height) {
          return 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

int jas_image_readcmpt(jas_image_t *image, unsigned cmptno, jas_image_coord_t x,
  jas_image_coord_t y, jas_image_coord_t width, jas_image_coord_t height,
  jas_matrix_t *data)
{
	jas_image_cmpt_t *cmpt;
	jas_image_coord_t i;
	jas_image_coord_t j;
	int k;
	jas_seqent_t v;
	int c;
	jas_seqent_t *dr;
	jas_seqent_t *d;
	int drs;

	JAS_DBGLOG(100, ("jas_image_readcmpt(%p, %d, %ld, %ld, %ld, %ld, %p)\n",
	  image, cmptno, JAS_CAST(long, x), JAS_CAST(long, y),
	  JAS_CAST(long, width), JAS_CAST(long, height), data));

	if(data == NULL) {
		return -1;
	}

	if (cmptno >= image->numcmpts_) {
		return -1;
	}

	cmpt = image->cmpts_[cmptno];
	if (x >= cmpt->width_ || y >= cmpt->height_ ||
	  x + width > cmpt->width_ ||
	  y + height > cmpt->height_) {
		return -1;
	}

	if (!jas_matrix_numrows(data) || !jas_matrix_numcols(data)) {
		return -1;
	}

	if (jas_matrix_numrows(data) != height || jas_matrix_numcols(data) != width) {
		if (jas_matrix_resize(data, height, width)) {
			return -1;
		}
	}

	dr = jas_matrix_getref(data, 0, 0);
	drs = jas_matrix_rowstep(data);
	for (i = 0; i < height; ++i, dr += drs) {
		d = dr;
		if (jas_stream_seek(cmpt->stream_, (cmpt->width_ * (y + i) + x)
		  * cmpt->cps_, SEEK_SET) < 0) {
			return -1;
		}
		for (j = width; j > 0; --j, ++d) {
			v = 0;
			for (k = cmpt->cps_; k > 0; --k) {
				if ((c = jas_stream_getc(cmpt->stream_)) == EOF) {
					return -1;
				}
				v = (v << 8) | (c & 0xff);
			}
			*d = bitstoint(v, cmpt->prec_, cmpt->sgnd_);
		}
	}

	return 0;
}